

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.c
# Opt level: O1

float ht_cpu_usage_get_percentage(HT_CPUUsageContext *context)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  char *pcVar4;
  FILE *pFVar5;
  HT_TimestampNs HVar6;
  float fVar7;
  char state;
  int int_data [5];
  unsigned_long stime;
  unsigned_long utime;
  uint flags;
  unsigned_long long_data [4];
  timespec time;
  
  clock_gettime(1,(timespec *)&time);
  HVar6 = time.tv_sec * 1000000000 + time.tv_nsec;
  pFVar5 = (FILE *)(ulong)(uint)context->pid;
  snprintf((char *)&time,0x20,"/proc/%d/stat");
  __stream = fopen((char *)&time,"r");
  bVar1 = true;
  if (__stream != (FILE *)0x0) {
    pFVar5 = __stream;
    sVar3 = fread(&time,1,0x3ff,__stream);
    fclose(__stream);
    if (0x4f < sVar3) {
      *(undefined1 *)((long)&time.tv_sec + sVar3) = 0;
      pcVar4 = strrchr((char *)&time,0x29);
      pFVar5 = (FILE *)int_data;
      iVar2 = __isoc99_sscanf(pcVar4 + 2,"%c %d %d %d %d %d %u %lu %lu %lu %lu %lu %lu",&state,
                              pFVar5,int_data + 1,int_data + 2,int_data + 3,int_data + 4,&flags,
                              long_data,long_data + 1,long_data + 2,long_data + 3,&utime,&stime);
      if (iVar2 == 0xd) {
        pFVar5 = (FILE *)(stime + utime);
        bVar1 = false;
      }
    }
  }
  if (bVar1) {
    fVar7 = -1.0;
  }
  else {
    fVar7 = ((float)((long)pFVar5 - context->last_total_time) * 100.0) /
            (((float)(HVar6 - context->last_probe) / 1e+09) * (float)_clock_ticks_per_sec);
    context->value = fVar7;
    context->last_total_time = (unsigned_long)pFVar5;
    context->last_probe = HVar6;
  }
  return fVar7;
}

Assistant:

float
ht_cpu_usage_get_percentage(HT_CPUUsageContext* context)
{
    HT_TimestampNs current_ts = ht_monotonic_clock_get_timestamp();
    unsigned long total_time;
    unsigned long tics;
    float elapsed;

    if (_get_process_time(&total_time, context->pid) == HT_FALSE)
    {
        return -1.0f;
    }

    tics = total_time - context->last_total_time;
    elapsed = (current_ts - context->last_probe) / 1000000000.0f;

    context->value = tics * 100.0f / (_clock_ticks_per_sec * elapsed);
    context->last_total_time = total_time;
    context->last_probe = current_ts;

    return context->value;
}